

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.hpp
# Opt level: O2

void __thiscall openjij::graph::Sparse<float>::Sparse(Sparse<float> *this,Sparse<float> *param_1)

{
  (this->super_Graph)._num_spins = (param_1->super_Graph)._num_spins;
  std::
  _Hashtable<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_float>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_float>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_unsigned_long>_>,_openjij::utility::PairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(this->_J)._M_h,&(param_1->_J)._M_h);
  this->_num_edges = param_1->_num_edges;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&this->_list_adj_nodes,&param_1->_list_adj_nodes);
  return;
}

Assistant:

Sparse(const Sparse<FloatType> &) = default;